

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O0

XMLContentModel * __thiscall
xercesc_4_0::ComplexTypeInfo::makeContentModel(ComplexTypeInfo *this,bool checkUPA)

{
  bool bVar1;
  int iVar2;
  NodeTypes NVar3;
  uint uVar4;
  NodeTypes NVar5;
  ContentSpecNode *pCVar6;
  undefined4 extraout_var;
  RuntimeException *pRVar7;
  QName *pQVar8;
  ContentSpecNode *pCVar9;
  QName *secondChild;
  NodeTypes specType;
  bool isMixed;
  XMLContentModel *cmRet;
  Janitor<xercesc_4_0::ContentSpecNode> janSpecNode;
  OutOfMemoryException *anon_var_0;
  ContentSpecNode *aSpecNode;
  bool checkUPA_local;
  ComplexTypeInfo *this_local;
  
  pCVar6 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
  ContentSpecNode::ContentSpecNode(pCVar6,this->fContentSpec);
  if (checkUPA) {
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(ulong)this->fContentSpecOrgURISize << 2);
    this->fContentSpecOrgURI = (uint *)CONCAT44(extraout_var,iVar2);
  }
  bVar1 = useRepeatingLeafNodes(this,pCVar6);
  pCVar6 = convertContentSpecTree(this,pCVar6,checkUPA,bVar1);
  Janitor<xercesc_4_0::ContentSpecNode>::Janitor
            ((Janitor<xercesc_4_0::ContentSpecNode> *)&cmRet,pCVar6);
  _specType = (DFAContentModel *)0x0;
  if ((this->fContentType != 5) && (this->fContentType != 6)) {
    if (this->fContentType == 2) {
      _specType = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
      MixedContentModel::MixedContentModel
                ((MixedContentModel *)_specType,false,pCVar6,false,this->fMemoryManager);
    }
    else {
      if ((this->fContentType != 3) && (this->fContentType != 4)) {
        pRVar7 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                   ,0x1df,CM_MustBeMixedOrChildren,this->fMemoryManager);
        __cxa_throw(pRVar7,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      bVar1 = this->fContentType == 3;
      if (pCVar6 == (ContentSpecNode *)0x0) {
        pRVar7 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                   ,0x174,CM_UnknownCMSpecType,this->fMemoryManager);
        __cxa_throw(pRVar7,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      NVar3 = ContentSpecNode::getType(pCVar6);
      pQVar8 = ContentSpecNode::getElement(pCVar6);
      if (pQVar8 != (QName *)0x0) {
        pQVar8 = ContentSpecNode::getElement(pCVar6);
        uVar4 = QName::getURI(pQVar8);
        if (uVar4 == 0xffffffff) {
          pRVar7 = (RuntimeException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    (pRVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                     ,0x17c,CM_NoPCDATAHere,this->fMemoryManager);
          __cxa_throw(pRVar7,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
      }
      if (((((NVar3 & (Any_NS|Any_Other)) != Any) && ((NVar3 & (Any_NS|Any_Other)) != Any_Other)) &&
          ((NVar3 & (Any_NS|Any_Other)) != Any_NS)) && (NVar3 != Loop)) {
        if (bVar1) {
          if (NVar3 == All) {
            _specType = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
            AllContentModel::AllContentModel
                      ((AllContentModel *)_specType,pCVar6,true,this->fMemoryManager);
          }
          else if (NVar3 == ZeroOrOne) {
            pCVar9 = ContentSpecNode::getFirst(pCVar6);
            NVar3 = ContentSpecNode::getType(pCVar9);
            if (NVar3 == All) {
              _specType = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
              pCVar9 = ContentSpecNode::getFirst(pCVar6);
              AllContentModel::AllContentModel
                        ((AllContentModel *)_specType,pCVar9,true,this->fMemoryManager);
            }
          }
        }
        else if (NVar3 == Leaf) {
          _specType = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
          pQVar8 = ContentSpecNode::getElement(pCVar6);
          SimpleContentModel::SimpleContentModel
                    ((SimpleContentModel *)_specType,false,pQVar8,(QName *)0x0,Leaf,
                     this->fMemoryManager);
        }
        else if (((NVar3 & (Any_NS|Any_Other)) == Choice) ||
                ((NVar3 & (Any_NS|Any_Other)) == Sequence)) {
          pCVar9 = ContentSpecNode::getFirst(pCVar6);
          NVar5 = ContentSpecNode::getType(pCVar9);
          if ((NVar5 == Leaf) &&
             (pCVar9 = ContentSpecNode::getSecond(pCVar6), pCVar9 != (ContentSpecNode *)0x0)) {
            pCVar9 = ContentSpecNode::getSecond(pCVar6);
            NVar5 = ContentSpecNode::getType(pCVar9);
            if (NVar5 == Leaf) {
              _specType = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
              pCVar9 = ContentSpecNode::getFirst(pCVar6);
              pQVar8 = ContentSpecNode::getElement(pCVar9);
              pCVar9 = ContentSpecNode::getSecond(pCVar6);
              secondChild = ContentSpecNode::getElement(pCVar9);
              SimpleContentModel::SimpleContentModel
                        ((SimpleContentModel *)_specType,false,pQVar8,secondChild,NVar3,
                         this->fMemoryManager);
            }
          }
        }
        else if (((NVar3 == OneOrMore) || (NVar3 == ZeroOrMore)) || (NVar3 == ZeroOrOne)) {
          pCVar9 = ContentSpecNode::getFirst(pCVar6);
          NVar5 = ContentSpecNode::getType(pCVar9);
          if (NVar5 == Leaf) {
            _specType = (DFAContentModel *)XMemory::operator_new(0x28,this->fMemoryManager);
            pCVar9 = ContentSpecNode::getFirst(pCVar6);
            pQVar8 = ContentSpecNode::getElement(pCVar9);
            SimpleContentModel::SimpleContentModel
                      ((SimpleContentModel *)_specType,false,pQVar8,(QName *)0x0,NVar3,
                       this->fMemoryManager);
          }
          else {
            pCVar9 = ContentSpecNode::getFirst(pCVar6);
            NVar3 = ContentSpecNode::getType(pCVar9);
            if (NVar3 == All) {
              _specType = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
              pCVar9 = ContentSpecNode::getFirst(pCVar6);
              AllContentModel::AllContentModel
                        ((AllContentModel *)_specType,pCVar9,false,this->fMemoryManager);
            }
          }
        }
        else {
          if (NVar3 != All) {
            pRVar7 = (RuntimeException *)__cxa_allocate_exception(0x30);
            RuntimeException::RuntimeException
                      (pRVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/ComplexTypeInfo.cpp"
                       ,0x1d6,CM_UnknownCMSpecType,this->fMemoryManager);
            __cxa_throw(pRVar7,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
          }
          _specType = (DFAContentModel *)XMemory::operator_new(0x30,this->fMemoryManager);
          AllContentModel::AllContentModel
                    ((AllContentModel *)_specType,pCVar6,false,this->fMemoryManager);
        }
      }
      if (_specType == (DFAContentModel *)0x0) {
        _specType = (DFAContentModel *)XMemory::operator_new(0x88,this->fMemoryManager);
        DFAContentModel::DFAContentModel(_specType,false,pCVar6,bVar1,this->fMemoryManager);
      }
    }
  }
  Janitor<xercesc_4_0::ContentSpecNode>::~Janitor((Janitor<xercesc_4_0::ContentSpecNode> *)&cmRet);
  return &_specType->super_XMLContentModel;
}

Assistant:

XMLContentModel* ComplexTypeInfo::makeContentModel(bool checkUPA)
{
    ContentSpecNode* aSpecNode = new (fMemoryManager) ContentSpecNode(*fContentSpec);

    if (checkUPA) {
        try
        {
            fContentSpecOrgURI = (unsigned int*) fMemoryManager->allocate
            (
                fContentSpecOrgURISize * sizeof(unsigned int)
            ); //new unsigned int[fContentSpecOrgURISize];
        }
        catch (const OutOfMemoryException&)
        {
            delete aSpecNode;

            throw;
        }
    }

    aSpecNode = convertContentSpecTree(aSpecNode, checkUPA, useRepeatingLeafNodes(aSpecNode));

    Janitor<ContentSpecNode> janSpecNode(aSpecNode);

    XMLContentModel* cmRet = 0;
    if (fContentType == SchemaElementDecl::Simple ||
        fContentType == SchemaElementDecl::ElementOnlyEmpty) {
       // just return nothing
    }
    else if (fContentType == SchemaElementDecl::Mixed_Simple)
    {
        //
        //  Just create a mixel content model object. This type of
        //  content model is optimized for mixed content validation.
        //
        cmRet = new (fMemoryManager) MixedContentModel(false, aSpecNode, false, fMemoryManager);
    }
    else if (fContentType == SchemaElementDecl::Mixed_Complex ||
             fContentType == SchemaElementDecl::Children)
    {
        bool isMixed = (fContentType == SchemaElementDecl::Mixed_Complex);

        //
        //  This method will create an optimal model for the complexity
        //  of the element's defined model. If its simple, it will create
        //  a SimpleContentModel object. If its a simple list, it will
        //  create a SimpleListContentModel object. If its complex, it
        //  will create a DFAContentModel object.
        //
        if(!aSpecNode)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);

        ContentSpecNode::NodeTypes specType = aSpecNode->getType();
        //
        //  Do a sanity check that the node is does not have a PCDATA id. Since,
        //  if it was, it should have already gotten taken by the Mixed model.
        //
        if (aSpecNode->getElement() && aSpecNode->getElement()->getURI() == XMLElementDecl::fgPCDataElemId)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoPCDATAHere, fMemoryManager);

        //
        //  According to the type of node, we will create the correct type of
        //  content model.
        //
        if (((specType & 0x0f) == ContentSpecNode::Any) ||
           ((specType & 0x0f) == ContentSpecNode::Any_Other) ||
           ((specType & 0x0f) == ContentSpecNode::Any_NS) ||
           specType == ContentSpecNode::Loop) {
           // let fall through to build a DFAContentModel
        }
        else if (isMixed)
        {
            if (specType == ContentSpecNode::All) {
                // All the nodes under an ALL must be additional ALL nodes and
                // ELEMENTs (or ELEMENTs under ZERO_OR_ONE nodes.)
                // We collapse the ELEMENTs into a single vector.
                cmRet = new (fMemoryManager) AllContentModel(aSpecNode, true, fMemoryManager);
            }
            else if (specType == ContentSpecNode::ZeroOrOne) {
                // An ALL node can appear under a ZERO_OR_ONE node.
                if (aSpecNode->getFirst()->getType() == ContentSpecNode::All) {
                    cmRet = new (fMemoryManager) AllContentModel(aSpecNode->getFirst(), true, fMemoryManager);
                }
            }

            // otherwise, let fall through to build a DFAContentModel
        }
         else if (specType == ContentSpecNode::Leaf)
        {
            // Create a simple content model
            cmRet = new (fMemoryManager) SimpleContentModel
            (
                false
                , aSpecNode->getElement()
                , 0
                , ContentSpecNode::Leaf
                , fMemoryManager
            );
        }
         else if (((specType & 0x0f) == ContentSpecNode::Choice)
              ||  ((specType & 0x0f) == ContentSpecNode::Sequence))
        {
            //
            //  Lets see if both of the children are leafs. If so, then it has to
            //  be a simple content model
            //
            if ((aSpecNode->getFirst()->getType() == ContentSpecNode::Leaf)
            &&  (aSpecNode->getSecond())
            &&  (aSpecNode->getSecond()->getType() == ContentSpecNode::Leaf))
            {
                cmRet = new (fMemoryManager) SimpleContentModel
                (
                    false
                    , aSpecNode->getFirst()->getElement()
                    , aSpecNode->getSecond()->getElement()
                    , specType
                    , fMemoryManager
                );
            }
        }
         else if ((specType == ContentSpecNode::OneOrMore)
              ||  (specType == ContentSpecNode::ZeroOrMore)
              ||  (specType == ContentSpecNode::ZeroOrOne))
        {
            //
            //  Its a repetition, so see if its one child is a leaf. If so its a
            //  repetition of a single element, so we can do a simple content
            //  model for that.
            //
            if (aSpecNode->getFirst()->getType() == ContentSpecNode::Leaf)
            {
                cmRet = new (fMemoryManager) SimpleContentModel
                (
                    false
                    , aSpecNode->getFirst()->getElement()
                    , 0
                    , specType
                    , fMemoryManager
                );
            }
            else if (aSpecNode->getFirst()->getType() == ContentSpecNode::All)
                cmRet = new (fMemoryManager) AllContentModel(aSpecNode->getFirst(), false, fMemoryManager);

        }
        else if (specType == ContentSpecNode::All)
            cmRet = new (fMemoryManager) AllContentModel(aSpecNode, false, fMemoryManager);
        else
        {
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
        }

        // Its not any simple type of content, so create a DFA based content model
        if(cmRet==0)
            cmRet = new (fMemoryManager) DFAContentModel(false, aSpecNode, isMixed, fMemoryManager);
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_MustBeMixedOrChildren, fMemoryManager);
    }

    return cmRet;
}